

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O2

void suidgid(char *user,uint ext)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *m0;
  uidgid ugid;
  uidgid local_104;
  
  if (ext == 0) {
    uVar1 = uidgid_get(&local_104,user);
    if (uVar1 != 0) goto LAB_0010345d;
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      fatal("unable to get password file entry");
    }
    m0 = "unknown account";
  }
  else {
    uVar1 = uidgids_get(&local_104,user);
    if (uVar1 != 0) goto LAB_0010345d;
    if (*user == ':') {
      fatalx("invalid uid/gids",user + 1);
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      fatal("unable to get password/group file entry");
    }
    m0 = "unknown user/group";
  }
  fatalx(m0,user);
LAB_0010345d:
  iVar2 = setgroups((long)local_104.gids,local_104.gid);
  if (iVar2 == -1) {
    fatal("unable to setgroups");
  }
  iVar2 = setgid(local_104.gid[0]);
  if (iVar2 == -1) {
    fatal("unable to setgid");
  }
  iVar2 = prot_uid(local_104.uid);
  if (iVar2 == -1) {
    fatal("unable to setuid");
  }
  return;
}

Assistant:

void suidgid(char *user, unsigned int ext) {
  struct uidgid ugid;

  if (ext) {
    if (! uidgids_get(&ugid, user)) {
      if (*user == ':') fatalx("invalid uid/gids", user +1);
      if (errno) fatal("unable to get password/group file entry");
      fatalx("unknown user/group", user);
    }
  }
  else
    if (! uidgid_get(&ugid, user)) {
      if (errno) fatal("unable to get password file entry");
      fatalx("unknown account", user);
    }
  if (setgroups(ugid.gids, ugid.gid) == -1) fatal("unable to setgroups");
  if (setgid(*ugid.gid) == -1) fatal("unable to setgid");
  if (prot_uid(ugid.uid) == -1) fatal("unable to setuid");
}